

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partition_strategy.c
# Opt level: O0

void av1_ml_early_term_after_split
               (AV1_COMP *cpi,MACROBLOCK *x,SIMPLE_MOTION_DATA_TREE *sms_tree,int64_t best_rd,
               int64_t part_none_rd,int64_t part_split_rd,int64_t *split_block_rd,
               PartitionSearchState *part_state)

{
  byte bVar1;
  bool bVar2;
  _Bool _Var3;
  int16_t iVar4;
  int iVar5;
  uint uVar6;
  float *features_00;
  int iVar7;
  long in_RCX;
  long in_RDX;
  float *in_RSI;
  long in_RDI;
  int64_t in_R8;
  int64_t in_R9;
  float fVar8;
  char *unaff_retaddr;
  long in_stack_00000008;
  int in_stack_00000010;
  undefined4 in_stack_00000014;
  int in_stack_00000018;
  float score;
  int min_bh;
  int min_bw;
  int i;
  float features [31];
  int f_idx;
  int bs;
  int dc_q;
  MACROBLOCKD *xd;
  float thresh;
  NN_CONFIG *nn_config;
  int is_480p_or_larger;
  AV1_COMMON *cm;
  BLOCK_SIZE bsize;
  int mi_col;
  int mi_row;
  PartitionBlkParams *blk_params;
  int *in_stack_00002a08;
  float *in_stack_00002a10;
  AV1_COMP *in_stack_00002a18;
  undefined8 in_stack_fffffffffffffeb8;
  int in_stack_fffffffffffffec0;
  float local_134;
  undefined4 in_stack_fffffffffffffed0;
  float in_stack_fffffffffffffed4;
  undefined4 in_stack_fffffffffffffed8;
  float in_stack_fffffffffffffedc;
  undefined4 in_stack_fffffffffffffee0;
  float in_stack_fffffffffffffee4;
  int local_10c;
  float local_108;
  int local_104;
  int local_100;
  int local_fc;
  float local_f8 [29];
  BLOCK_SIZE in_stack_ffffffffffffff7f;
  int in_stack_ffffffffffffff80;
  int iVar9;
  MACROBLOCK *x_00;
  undefined4 in_stack_ffffffffffffff98;
  NN_CONFIG *local_60;
  int in_stack_ffffffffffffffb8;
  BLOCK_SIZE bsize_00;
  undefined1 is_test_mode;
  
  bVar1 = *(byte *)(CONCAT44(in_stack_00000014,in_stack_00000010) + 0x30);
  if (((0 < in_RCX) && (in_RCX != 0x7fffffffffffffff)) &&
     (*(int *)(CONCAT44(in_stack_00000014,in_stack_00000010) + 0x118) == 0)) {
    features_00 = (float *)(in_RDI + 0x3bf80);
    if (*(int *)(in_RDI + 0x3bfb8) < *(int *)(in_RDI + 0x3bfbc)) {
      local_10c = *(int *)(in_RDI + 0x3bfb8);
    }
    else {
      local_10c = *(int *)(in_RDI + 0x3bfbc);
    }
    bVar2 = local_10c < 0x1e0;
    local_60 = (NN_CONFIG *)0x0;
    local_134 = -1e+06;
    switch(bVar1) {
    case 0:
      break;
    default:
      break;
    case 3:
      local_60 = &av1_early_term_after_split_nnconfig_8;
      local_134 = -1.0;
      if (bVar2) {
        local_134 = -1.4;
      }
      break;
    case 6:
      local_60 = &av1_early_term_after_split_nnconfig_16;
      in_stack_fffffffffffffed0 = 0xc019999a;
      in_stack_fffffffffffffed4 = -2.0;
      local_134 = in_stack_fffffffffffffed4;
      if (bVar2) {
        in_stack_fffffffffffffed4 = -2.4;
        local_134 = in_stack_fffffffffffffed4;
      }
      break;
    case 9:
      local_60 = &av1_early_term_after_split_nnconfig_32;
      in_stack_fffffffffffffed8 = 0xc0133333;
      in_stack_fffffffffffffedc = -2.6;
      local_134 = in_stack_fffffffffffffedc;
      if (bVar2) {
        in_stack_fffffffffffffedc = -2.3;
        local_134 = in_stack_fffffffffffffedc;
      }
      break;
    case 0xc:
      local_60 = &av1_early_term_after_split_nnconfig_64;
      in_stack_fffffffffffffee0 = 0xbf99999a;
      in_stack_fffffffffffffee4 = -2.0;
      local_134 = in_stack_fffffffffffffee4;
      if (bVar2) {
        in_stack_fffffffffffffee4 = -1.2;
        local_134 = in_stack_fffffffffffffee4;
      }
      break;
    case 0xf:
    }
    if (local_60 != (NN_CONFIG *)0x0) {
      if (*(int *)(in_RDI + 0x60960) < 2) {
        local_134 = local_134 - 0.3;
      }
      x_00 = (MACROBLOCK *)(in_RSI + 0x68);
      iVar4 = av1_dc_quant_QTX(in_stack_fffffffffffffec0,
                               (int)((ulong)in_stack_fffffffffffffeb8 >> 0x20),
                               (aom_bit_depth_t)in_stack_fffffffffffffeb8);
      iVar5 = (int)iVar4 >> ((char)*(undefined4 *)((x_00->e_mbd).weight[4] + 4) - 8U & 0x1f);
      uVar6 = (uint)block_size_wide[bVar1];
      iVar9 = 0;
      memset(local_f8,0,0x7c);
      fVar8 = log1pf((float)iVar5 / 4.0);
      iVar7 = iVar9 + 1;
      local_f8[iVar9] = fVar8;
      fVar8 = log1pf((((float)in_RCX / (float)(int)uVar6) / (float)(int)uVar6) / 1024.0);
      iVar9 = iVar7 + 1;
      local_f8[iVar7] = fVar8;
      add_rd_feature(in_R8,in_RCX,local_f8,(int *)&stack0xffffffffffffff84);
      add_rd_feature(in_R9,in_RCX,local_f8,(int *)&stack0xffffffffffffff84);
      for (local_fc = 0; is_test_mode = (undefined1)((ulong)in_RDI >> 0x38), local_fc < 4;
          local_fc = local_fc + 1) {
        add_rd_feature(*(int64_t *)(in_stack_00000008 + (long)local_fc * 8),in_RCX,local_f8,
                       (int *)&stack0xffffffffffffff84);
        local_100 = 7;
        local_104 = 7;
        get_min_bsize((SIMPLE_MOTION_DATA_TREE *)
                      CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                      (int *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),
                      (int *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0));
        iVar7 = iVar9 + 1;
        local_f8[iVar9] = (float)local_100;
        iVar9 = iVar7 + 1;
        local_f8[iVar7] = (float)local_104;
      }
      simple_motion_search_prune_part_features
                ((AV1_COMP *)CONCAT44(local_134,in_stack_ffffffffffffff98),x_00,
                 (SIMPLE_MOTION_DATA_TREE *)CONCAT44(iVar5,uVar6),iVar9,in_stack_ffffffffffffff80,
                 in_stack_ffffffffffffff7f,features_00,in_stack_ffffffffffffffb8);
      bsize_00 = (BLOCK_SIZE)((ulong)in_RCX >> 0x38);
      fVar8 = log1pf((float)*(uint *)(in_RDX + 0x4c));
      iVar5 = iVar9 + 1;
      local_f8[iVar9] = fVar8;
      fVar8 = log1pf((float)*(uint *)(*(long *)(in_RDX + 8) + 0x4c));
      iVar7 = iVar5 + 1;
      local_f8[iVar5] = fVar8;
      fVar8 = log1pf((float)*(uint *)(*(long *)(in_RDX + 0x10) + 0x4c));
      iVar5 = iVar7 + 1;
      local_f8[iVar7] = fVar8;
      fVar8 = log1pf((float)*(uint *)(*(long *)(in_RDX + 0x18) + 0x4c));
      iVar7 = iVar5 + 1;
      local_f8[iVar5] = fVar8;
      fVar8 = log1pf((float)*(uint *)(*(long *)(in_RDX + 0x20) + 0x4c));
      iVar5 = iVar7 + 1;
      local_f8[iVar7] = fVar8;
      fVar8 = log1pf((float)*(uint *)(in_RDX + 0x54));
      iVar7 = iVar5 + 1;
      local_f8[iVar5] = fVar8;
      fVar8 = log1pf((float)*(uint *)(in_RDX + 0x5c));
      iVar5 = iVar7 + 1;
      local_f8[iVar7] = fVar8;
      fVar8 = log1pf((float)*(uint *)(in_RDX + 100));
      iVar7 = iVar5 + 1;
      local_f8[iVar5] = fVar8;
      fVar8 = log1pf((float)*(uint *)(in_RDX + 0x6c));
      local_f8[iVar7] = fVar8;
      write_features_to_file
                (unaff_retaddr,(_Bool)is_test_mode,in_RSI,(int)((ulong)in_RDX >> 0x20),(int)in_RDX,
                 bsize_00,in_stack_00000010,in_stack_00000018);
      _Var3 = ext_ml_model_decision_after_split
                        (in_stack_00002a18,in_stack_00002a10,in_stack_00002a08);
      if (!_Var3) {
        local_108 = 0.0;
        (*av1_nn_predict)(local_f8,local_60,1,&local_108);
        if (local_108 < local_134) {
          *(undefined4 *)(CONCAT44(in_stack_00000014,in_stack_00000010) + 0x118) = 1;
        }
      }
    }
  }
  return;
}

Assistant:

void av1_ml_early_term_after_split(AV1_COMP *const cpi, MACROBLOCK *const x,
                                   SIMPLE_MOTION_DATA_TREE *const sms_tree,
                                   int64_t best_rd, int64_t part_none_rd,
                                   int64_t part_split_rd,
                                   int64_t *split_block_rd,
                                   PartitionSearchState *part_state) {
  const PartitionBlkParams *blk_params = &part_state->part_blk_params;
  const int mi_row = blk_params->mi_row, mi_col = blk_params->mi_col;
  const BLOCK_SIZE bsize = blk_params->bsize;

  if (best_rd <= 0 || best_rd == INT64_MAX ||
      part_state->terminate_partition_search)
    return;

  const AV1_COMMON *const cm = &cpi->common;
  const int is_480p_or_larger = AOMMIN(cm->width, cm->height) >= 480;
  const NN_CONFIG *nn_config = NULL;
  float thresh = -1e6;
  switch (bsize) {
    case BLOCK_128X128: break;
    case BLOCK_64X64:
      nn_config = &av1_early_term_after_split_nnconfig_64;
      thresh = is_480p_or_larger ? -2.0f : -1.2f;
      break;
    case BLOCK_32X32:
      nn_config = &av1_early_term_after_split_nnconfig_32;
      thresh = is_480p_or_larger ? -2.6f : -2.3f;
      break;
    case BLOCK_16X16:
      nn_config = &av1_early_term_after_split_nnconfig_16;
      thresh = is_480p_or_larger ? -2.0f : -2.4f;
      break;
    case BLOCK_8X8:
      nn_config = &av1_early_term_after_split_nnconfig_8;
      thresh = is_480p_or_larger ? -1.0f : -1.4f;
      break;
    case BLOCK_4X4: break;
    default:
      assert(0 && "Invalid block size in av1_ml_early_term_after_split().");
      break;
  }
  if (!nn_config) return;

  // Use more conservative threshold for level 1.
  if (cpi->sf.part_sf.ml_early_term_after_part_split_level < 2) thresh -= 0.3f;

  const MACROBLOCKD *const xd = &x->e_mbd;
  const int dc_q = av1_dc_quant_QTX(x->qindex, 0, xd->bd) >> (xd->bd - 8);
  const int bs = block_size_wide[bsize];
  int f_idx = 0;
  float features[FEATURES] = { 0.0f };

  features[f_idx++] = log1pf((float)dc_q / 4.0f);
  features[f_idx++] = log1pf((float)best_rd / bs / bs / 1024.0f);

  add_rd_feature(part_none_rd, best_rd, features, &f_idx);
  add_rd_feature(part_split_rd, best_rd, features, &f_idx);

  for (int i = 0; i < SUB_PARTITIONS_SPLIT; ++i) {
    add_rd_feature(split_block_rd[i], best_rd, features, &f_idx);
    int min_bw = MAX_SB_SIZE_LOG2;
    int min_bh = MAX_SB_SIZE_LOG2;
    get_min_bsize(sms_tree->split[i], &min_bw, &min_bh);
    features[f_idx++] = (float)min_bw;
    features[f_idx++] = (float)min_bh;
  }

  simple_motion_search_prune_part_features(cpi, x, sms_tree, mi_row, mi_col,
                                           bsize, NULL,
                                           FEATURE_SMS_PRUNE_PART_FLAG);

  features[f_idx++] = log1pf((float)sms_tree->sms_none_feat[1]);

  features[f_idx++] = log1pf((float)sms_tree->split[0]->sms_none_feat[1]);
  features[f_idx++] = log1pf((float)sms_tree->split[1]->sms_none_feat[1]);
  features[f_idx++] = log1pf((float)sms_tree->split[2]->sms_none_feat[1]);
  features[f_idx++] = log1pf((float)sms_tree->split[3]->sms_none_feat[1]);

  features[f_idx++] = log1pf((float)sms_tree->sms_rect_feat[1]);
  features[f_idx++] = log1pf((float)sms_tree->sms_rect_feat[3]);
  features[f_idx++] = log1pf((float)sms_tree->sms_rect_feat[5]);
  features[f_idx++] = log1pf((float)sms_tree->sms_rect_feat[7]);

  assert(f_idx == FEATURES);

  // Write features to file
  write_features_to_file(cpi->oxcf.partition_info_path,
                         cpi->ext_part_controller.test_mode, features, FEATURES,
                         4, bsize, mi_row, mi_col);

  if (ext_ml_model_decision_after_split(
          cpi, features, &part_state->terminate_partition_search)) {
    return;
  }

  float score = 0.0f;
  av1_nn_predict(features, nn_config, 1, &score);
  // Score is indicator of confidence that we should NOT terminate.
  if (score < thresh) {
    part_state->terminate_partition_search = 1;
  }
}